

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.h
# Opt level: O3

void __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
Destroy<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>>
          (RepeatedPtrFieldBase *this)

{
  Rep *pRVar1;
  int iVar2;
  
  if (this->tagged_rep_or_elem_ != (void *)0x0) {
    if (this->arena_ == (Arena *)0x0) {
      iVar2 = 1;
      if (((ulong)this->tagged_rep_or_elem_ & 1) != 0) {
        pRVar1 = rep(this);
        iVar2 = pRVar1->allocated_size;
      }
      if (this->capacity_proxy_ + 1 < iVar2) goto LAB_0026b761;
      Destroy<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>>();
    }
    return;
  }
  Destroy<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>>
            ((RepeatedPtrFieldBase *)&stack0xffffffffffffffe8);
LAB_0026b761:
  Destroy<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>>();
}

Assistant:

inline bool NeedsDestroy() const {
    // Either there is an allocated element in SSO buffer or there is an
    // allocated Rep.
    return tagged_rep_or_elem_ != nullptr;
  }